

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

void __thiscall efsw::FileInfo::getInfo(FileInfo *this)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [4];
  int res;
  stat st;
  bool slashAtEnd;
  FileInfo *this_local;
  
  st.__glibc_reserved[2]._7_1_ = FileSystem::slashAtEnd(&this->Filepath);
  if ((bool)st.__glibc_reserved[2]._7_1_) {
    FileSystem::dirRemoveSlashAtEnd(&this->Filepath);
  }
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if (iVar1 == 0) {
    this->ModificationTime = st.st_atim.tv_nsec;
    this->Size = st.st_rdev;
    this->OwnerId = st.st_nlink._4_4_;
    this->GroupId = st.st_mode;
    this->Permissions = (Uint32)st.st_nlink;
    this->Inode = st.st_dev;
  }
  if ((st.__glibc_reserved[2]._7_1_ & 1) != 0) {
    FileSystem::dirAddSlashAtEnd(&this->Filepath);
  }
  return;
}

Assistant:

void FileInfo::getInfo() {
#if EFSW_PLATFORM == EFSW_PLATFORM_WIN32
	if ( Filepath.size() == 3 && Filepath[1] == ':' && Filepath[2] == FileSystem::getOSSlash() ) {
		Filepath += FileSystem::getOSSlash();
	}
#endif

	/// Why i'm doing this? stat in mingw32 doesn't work for directories if the dir path ends with a
	/// path slash
	bool slashAtEnd = FileSystem::slashAtEnd( Filepath );

	if ( slashAtEnd ) {
		FileSystem::dirRemoveSlashAtEnd( Filepath );
	}

#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	struct stat st;
	int res = stat( Filepath.c_str(), &st );
#else
	struct _stat st;
	int res = _wstat( String::fromUtf8( Filepath ).toWideString().c_str(), &st );
#endif

	if ( 0 == res ) {
		ModificationTime = st.st_mtime;
		Size = st.st_size;
		OwnerId = st.st_uid;
		GroupId = st.st_gid;
		Permissions = st.st_mode;
		Inode = st.st_ino;
	}

	if ( slashAtEnd ) {
		FileSystem::dirAddSlashAtEnd( Filepath );
	}
}